

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleBuffer.cpp
# Opt level: O3

void __thiscall
btTriangleBuffer::processTriangle
          (btTriangleBuffer *this,btVector3 *triangle,int partId,int triangleIndex)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  void *pvVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  
  uVar3 = *(undefined8 *)triangle->m_floats;
  uVar4 = *(undefined8 *)(triangle->m_floats + 2);
  uVar5 = *(undefined8 *)triangle[1].m_floats;
  uVar6 = *(undefined8 *)(triangle[1].m_floats + 2);
  uVar7 = *(undefined8 *)triangle[2].m_floats;
  uVar8 = *(undefined8 *)(triangle[2].m_floats + 2);
  uVar14 = *(uint *)&this->field_0xc;
  if (uVar14 == *(uint *)&this->field_0x10) {
    iVar18 = 1;
    if (uVar14 != 0) {
      iVar18 = uVar14 * 2;
    }
    if ((int)uVar14 < iVar18) {
      if (iVar18 == 0) {
        pvVar15 = (void *)0x0;
      }
      else {
        pvVar15 = btAlignedAllocInternal((long)iVar18 * 0x38,0x10);
        uVar14 = *(uint *)&this->field_0xc;
      }
      if (0 < (int)uVar14) {
        lVar17 = 0;
        do {
          lVar16 = *(long *)&this->field_0x18;
          *(undefined8 *)((long)pvVar15 + lVar17 + 0x30) = *(undefined8 *)(lVar16 + 0x30 + lVar17);
          uVar9 = *(undefined8 *)(lVar16 + lVar17);
          uVar10 = ((undefined8 *)(lVar16 + lVar17))[1];
          puVar1 = (undefined8 *)(lVar16 + 0x10 + lVar17);
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          puVar1 = (undefined8 *)(lVar16 + 0x20 + lVar17);
          uVar13 = puVar1[1];
          puVar2 = (undefined8 *)((long)pvVar15 + lVar17 + 0x20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar13;
          puVar1 = (undefined8 *)((long)pvVar15 + lVar17 + 0x10);
          *puVar1 = uVar11;
          puVar1[1] = uVar12;
          *(undefined8 *)((long)pvVar15 + lVar17) = uVar9;
          ((undefined8 *)((long)pvVar15 + lVar17))[1] = uVar10;
          lVar17 = lVar17 + 0x38;
        } while ((ulong)uVar14 * 0x38 - lVar17 != 0);
      }
      if ((*(void **)&this->field_0x18 != (void *)0x0) && (this->field_0x20 == '\x01')) {
        btAlignedFreeInternal(*(void **)&this->field_0x18);
      }
      this->field_0x20 = 1;
      *(void **)&this->field_0x18 = pvVar15;
      *(int *)&this->field_0x10 = iVar18;
      uVar14 = *(uint *)&this->field_0xc;
    }
  }
  lVar17 = *(long *)&this->field_0x18;
  lVar16 = (long)(int)uVar14 * 0x38;
  puVar1 = (undefined8 *)(lVar17 + 0x20 + lVar16);
  *puVar1 = uVar7;
  puVar1[1] = uVar8;
  puVar1 = (undefined8 *)(lVar17 + 0x10 + lVar16);
  *puVar1 = uVar5;
  puVar1[1] = uVar6;
  *(undefined8 *)(lVar17 + lVar16) = uVar3;
  ((undefined8 *)(lVar17 + lVar16))[1] = uVar4;
  *(int *)(lVar17 + 0x30 + lVar16) = partId;
  *(int *)(lVar17 + 0x34 + lVar16) = triangleIndex;
  *(int *)&this->field_0xc = *(int *)&this->field_0xc + 1;
  return;
}

Assistant:

void btTriangleBuffer::processTriangle(btVector3* triangle,int partId,int  triangleIndex)
{
		btTriangle	tri;
		tri.m_vertex0 = triangle[0];
		tri.m_vertex1 = triangle[1];
		tri.m_vertex2 = triangle[2];
		tri.m_partId = partId;
		tri.m_triangleIndex = triangleIndex;
			
		m_triangleBuffer.push_back(tri);
}